

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAux.h
# Opt level: O0

void __thiscall BamTools::RefData::~RefData(RefData *this)

{
  RefData *this_local;
  
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

struct API_EXPORT RefData
{

    std::string RefName;  //!< name of reference sequence
    int32_t RefLength;    //!< length of reference sequence

    //! constructor
    RefData(const std::string& name = std::string(), const int32_t& length = 0)
        : RefName(name)
        , RefLength(length)
    {}
}